

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcReinforcingElement::~IfcReinforcingElement(IfcReinforcingElement *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x50 = 0x86f6d0;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x38 = 0x86f810;
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd8 = 0x86f6f8;
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.field_0xe8 = 0x86f720;
  *(undefined8 *)
   &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.field_0x120
       = 0x86f748;
  *(undefined8 *)&this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.field_0x150 =
       0x86f770;
  *(undefined8 *)&this[-1].field_0x188 = 0x86f798;
  *(undefined8 *)&this[-1].field_0x198 = 0x86f7c0;
  *(undefined8 *)
   &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0x86f7e8;
  puVar1 = *(undefined1 **)
            &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
             super_IfcProduct.super_IfcObject.field_0x10;
  puVar2 = &(this->super_IfcBuildingElementComponent).super_IfcBuildingElement.super_IfcElement.
            super_IfcProduct.super_IfcObject.field_0x20;
  if (puVar1 != puVar2) {
    operator_delete(puVar1,*(long *)puVar2 + 1);
  }
  IfcElement::~IfcElement
            ((IfcElement *)
             &this[-1].super_IfcBuildingElementComponent.super_IfcBuildingElement.super_IfcElement.
              super_IfcProduct.super_IfcObject.field_0x50,&PTR_construction_vtable_24__0086f838);
  return;
}

Assistant:

IfcReinforcingElement() : Object("IfcReinforcingElement") {}